

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O0

void PrintFinalStats(void *kmem)

{
  undefined4 local_4c;
  undefined8 uStack_48;
  int flag;
  long nfeSG;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long nfe;
  long nni;
  void *kmem_local;
  
  nni = (long)kmem;
  local_4c = KINGetNumNonlinSolvIters(kmem,&nfe);
  check_flag(&local_4c,"KINGetNumNonlinSolvIters",1);
  local_4c = KINGetNumFuncEvals(nni,&nli);
  check_flag(&local_4c,"KINGetNumFuncEvals",1);
  local_4c = KINGetNumLinIters(nni,&npe);
  check_flag(&local_4c,"KINGetNumLinIters",1);
  local_4c = KINGetNumPrecEvals(nni,&nps);
  check_flag(&local_4c,"KINGetNumPrecEvals",1);
  local_4c = KINGetNumPrecSolves(nni,&ncfl);
  check_flag(&local_4c,"KINGetNumPrecSolves",1);
  local_4c = KINGetNumLinConvFails(nni,&nfeSG);
  check_flag(&local_4c,"KINGetNumLinConvFails",1);
  local_4c = KINGetNumLinFuncEvals(nni,&stack0xffffffffffffffb8);
  check_flag(&local_4c,"KINGetNumLinFuncEvals",1);
  printf("Final Statistics.. \n");
  printf("nni    = %5ld    nli   = %5ld\n",nfe,npe);
  printf("nfe    = %5ld    nfeSG = %5ld\n",nli,uStack_48);
  printf("nps    = %5ld    npe   = %5ld     ncfl  = %5ld\n",ncfl,nps,nfeSG);
  return;
}

Assistant:

static void PrintFinalStats(void *kmem)
{
  long int nni, nfe, nli, npe, nps, ncfl, nfeSG;
  int flag;

  flag = KINGetNumNonlinSolvIters(kmem, &nni);
  check_flag(&flag, "KINGetNumNonlinSolvIters", 1);
  flag = KINGetNumFuncEvals(kmem, &nfe);
  check_flag(&flag, "KINGetNumFuncEvals", 1);
  flag = KINGetNumLinIters(kmem, &nli);
  check_flag(&flag, "KINGetNumLinIters", 1);
  flag = KINGetNumPrecEvals(kmem, &npe);
  check_flag(&flag, "KINGetNumPrecEvals", 1);
  flag = KINGetNumPrecSolves(kmem, &nps);
  check_flag(&flag, "KINGetNumPrecSolves", 1);
  flag = KINGetNumLinConvFails(kmem, &ncfl);
  check_flag(&flag, "KINGetNumLinConvFails", 1);
  flag = KINGetNumLinFuncEvals(kmem, &nfeSG);
  check_flag(&flag, "KINGetNumLinFuncEvals", 1);

  printf("Final Statistics.. \n");
  printf("nni    = %5ld    nli   = %5ld\n", nni, nli);
  printf("nfe    = %5ld    nfeSG = %5ld\n", nfe, nfeSG);
  printf("nps    = %5ld    npe   = %5ld     ncfl  = %5ld\n", nps, npe, ncfl);

}